

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

int __thiscall FBehavior::FindStringInChunk(FBehavior *this,DWORD *names,char *varname)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  if (names != (DWORD *)0x0) {
    uVar2 = (ulong)names[2];
    bVar4 = uVar2 != 0;
    if (bVar4) {
      iVar1 = strcasecmp(varname,(char *)((long)names + (ulong)names[3] + 8));
      if (iVar1 == 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = 0;
        do {
          if (uVar2 - 1 == uVar3) {
            return -1;
          }
          iVar1 = strcasecmp(varname,(char *)((long)names + (ulong)names[(int)uVar3 + 4] + 8));
          uVar3 = uVar3 + 1;
        } while (iVar1 != 0);
        bVar4 = uVar3 < uVar2;
      }
      if (bVar4) {
        return (int)uVar3;
      }
    }
  }
  return -1;
}

Assistant:

int FBehavior::FindStringInChunk (DWORD *names, const char *varname) const
{
	if (names != NULL)
	{
		DWORD i;

		for (i = 0; i < LittleLong(names[2]); ++i)
		{
			if (stricmp (varname, (char *)(names + 2) + LittleLong(names[3+i])) == 0)
			{
				return (int)i;
			}
		}
	}
	return -1;
}